

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_13161f6::HBDMinMaxTest_MaxValue_Test::TestBody(HBDMinMaxTest_MaxValue_Test *this)

{
  bool bVar1;
  void *pvVar2;
  int *in_RDI;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  RegisterStateCheckMMX reg_check_mmx;
  RegisterStateCheck reg_check;
  int max;
  int min;
  int i;
  uint8_t *b;
  uint8_t *a;
  AssertHelper *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  Type in_stack_ffffffffffffff7c;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff80;
  AssertionResult local_68 [2];
  undefined1 local_42 [10];
  Message *in_stack_ffffffffffffffc8;
  AssertHelper *in_stack_ffffffffffffffd0;
  undefined1 local_24 [4];
  undefined1 local_20 [4];
  int local_1c;
  ulong local_18;
  ulong local_10;
  
  pvVar2 = aom_malloc(0xbc3e56);
  local_10 = (ulong)pvVar2 >> 1;
  pvVar2 = aom_malloc(0xbc3e6b);
  local_18 = (ulong)pvVar2 >> 1;
  for (local_1c = 0; local_1c < 0x40; local_1c = local_1c + 1) {
    aom_memset16((void *)(local_10 << 1),0,0x40);
    aom_memset16((void *)(local_18 << 1),0,0x40);
    *(short *)(local_18 * 2 + (long)local_1c * 2) = (short)local_1c;
    libaom_test::RegisterStateCheckMMX::RegisterStateCheckMMX
              ((RegisterStateCheckMMX *)&local_68[2].field_0x6);
    (**(code **)(in_RDI + 6))(local_10,8,local_18,8,local_20,local_24);
    libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX((RegisterStateCheckMMX *)0xbc3f26);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               in_stack_ffffffffffffff60,in_RDI,(int *)in_stack_ffffffffffffff50);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_68);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff80._M_head_impl);
      in_stack_ffffffffffffff50 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xbc3f96);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_ffffffffffffff80._M_head_impl,in_stack_ffffffffffffff7c,
                 (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff50);
      testing::Message::~Message((Message *)0xbc3fe4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc4037);
    in_stack_ffffffffffffff74 = 0;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               in_stack_ffffffffffffff60,in_RDI,(int *)in_stack_ffffffffffffff50);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffff78);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff80._M_head_impl);
      testing::AssertionResult::failure_message((AssertionResult *)0xbc409e);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_ffffffffffffff80._M_head_impl,in_stack_ffffffffffffff7c,
                 (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff50);
      testing::Message::~Message((Message *)0xbc40ea);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc413a);
  }
  aom_free(in_stack_ffffffffffffff50);
  aom_free(in_stack_ffffffffffffff50);
  return;
}

Assistant:

TEST_P(HBDMinMaxTest, MaxValue) {
  uint8_t *a = CONVERT_TO_BYTEPTR(
      reinterpret_cast<uint16_t *>(aom_malloc(64 * sizeof(uint16_t))));
  uint8_t *b = CONVERT_TO_BYTEPTR(
      reinterpret_cast<uint16_t *>(aom_malloc(64 * sizeof(uint16_t))));
  for (int i = 0; i < 64; i++) {
    aom_memset16(CONVERT_TO_SHORTPTR(a), 0, 64);
    aom_memset16(CONVERT_TO_SHORTPTR(b), 0, 64);
    CONVERT_TO_SHORTPTR(b)[i] = i;  // Set a minimum difference of i.

    int min, max;
    API_REGISTER_STATE_CHECK(mm_func_(a, 8, b, 8, &min, &max));
    EXPECT_EQ(i, max);
    EXPECT_EQ(0, min);
  }
  aom_free(CONVERT_TO_SHORTPTR(a));
  aom_free(CONVERT_TO_SHORTPTR(b));
}